

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

optional<std::shared_ptr<IfStatementAstNode>_> * __thiscall
Parser::parseIfStatement
          (optional<std::shared_ptr<IfStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  bool *__other;
  int iVar1;
  undefined8 this_00;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  TokenType type;
  IfStatementAstNode *__p;
  undefined1 local_e0 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  undefined1 local_c0 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  size_type __dnew_2;
  optional<std::shared_ptr<StatementAstNode>_> elseStatement;
  optional<std::shared_ptr<ExpressionAstNode>_> expression;
  optional<std::shared_ptr<StatementAstNode>_> ifStatement;
  bool local_40;
  undefined5 uStack_3f;
  undefined2 uStack_3a;
  undefined6 uStack_38;
  undefined1 local_32;
  byte local_29;
  bool error;
  
  local_29 = 0;
  local_40 = true;
  uStack_3f = 0x7463657078;
  uStack_3a = 0x6465;
  uStack_38 = 0x6669206e6120;
  local_32 = 0;
  type = (TokenType)this;
  ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ = &local_40;
  expect((Parser *)local_e0,type,(bool *)0xd,(string *)&local_29);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
  }
  if ((bool *)ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ != &local_40)
  {
    operator_delete((void *)ifStatement.
                            super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_
                    ,CONCAT26(uStack_3a,CONCAT51(uStack_3f,local_40)) + 1);
  }
  skipWhiteSpace(this);
  elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged = true;
  elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._17_7_ = 0;
  ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ = &local_40;
  ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ =
       std::__cxx11::string::_M_create
                 ((ulong *)&ifStatement.
                            super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                            _M_engaged,
                  (ulong)&elseStatement.
                          super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                          _M_engaged);
  local_40 = elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
             _M_payload.
             super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
             super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged;
  uStack_3f = elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._17_5_;
  uStack_3a = elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._22_2_;
  builtin_strncpy((char *)ifStatement.
                          super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_,
                  "Expected a left paren after if",0x1e);
  *(char *)(ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ +
           elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
           _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
           .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_) = '\0';
  expect((Parser *)(local_e0 + 0x10),type,(bool *)0x5,(string *)&local_29);
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  if ((bool *)ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ != &local_40)
  {
    operator_delete((void *)ifStatement.
                            super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_
                    ,CONCAT26(uStack_3a,CONCAT51(uStack_3f,local_40)) + 1);
  }
  parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)
                  &elseStatement.
                   super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
                   super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                   super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged,this)
  ;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged = true;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._17_7_ = 0;
  ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ = &local_40;
  ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ =
       std::__cxx11::string::_M_create
                 ((ulong *)&ifStatement.
                            super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                            _M_engaged,
                  (ulong)&expression.
                          super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.
                          _M_engaged);
  this_00 = expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_;
  local_40 = expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
             _M_payload.
             super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
             super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged;
  uStack_3f = expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._17_5_;
  uStack_3a = expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._22_2_;
  builtin_strncpy((char *)ifStatement.
                          super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                          _M_payload.
                          super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                          .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_,
                  "Expected a right paren after expression of if",0x2d);
  *(char *)(ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ +
           expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
           _M_payload.
           super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
           super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_) = '\0';
  expect((Parser *)local_c0,type,(bool *)0x6,(string *)&local_29);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
  }
  if ((bool *)ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ != &local_40)
  {
    operator_delete((void *)ifStatement.
                            super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_
                    ,CONCAT26(uStack_3a,CONCAT51(uStack_3f,local_40)) + 1);
  }
  parseStatement((optional<std::shared_ptr<StatementAstNode>_> *)
                 &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                  _M_payload.
                  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,this)
  ;
  elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ = 0;
  TokenBuffer::currentToken
            ((TokenBuffer *)
             &ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged);
  iVar1 = *(int *)(ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                   super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ + 0x20);
  if (this_00 != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  if (iVar1 == 0xe) {
    local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x10;
    ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ = &local_40;
    ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ =
         std::__cxx11::string::_M_create
                   ((ulong *)&ifStatement.
                              super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                              _M_payload.
                              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                              .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                              _M_engaged,(ulong)&local_a0);
    p_Var3 = local_a0;
    local_40 = SUB81(local_a0,0);
    uStack_3f = (undefined5)((ulong)local_a0 >> 8);
    uStack_3a = (undefined2)((ulong)local_a0 >> 0x30);
    builtin_strncpy((char *)ifStatement.
                            super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                            _M_payload.
                            super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                            .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_
                    ,"Expected an else",0x10);
    *(char *)(ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ +
             (long)local_a0) = '\0';
    expect((Parser *)(local_c0 + 0x10),type,(bool *)0xe,(string *)&local_29);
    if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
    }
    if ((bool *)ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ != &local_40
       ) {
      operator_delete((void *)ifStatement.
                              super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                              _M_payload.
                              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                              .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                              _16_8_,CONCAT26(uStack_3a,CONCAT51(uStack_3f,local_40)) + 1);
    }
    __other = &ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
               _M_payload.
               super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
               super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged;
    parseStatement((optional<std::shared_ptr<StatementAstNode>_> *)__other,this);
    std::_Optional_payload_base<std::shared_ptr<StatementAstNode>_>::_M_copy_assign
              ((_Optional_payload_base<std::shared_ptr<StatementAstNode>_> *)&__dnew_2,
               (_Optional_payload_base<std::shared_ptr<StatementAstNode>_> *)__other);
    if (local_40 == true) {
      local_40 = false;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
    }
    if (((local_29 != 0) ||
        (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
         _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ !=
         '\x01')) ||
       ((ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
         _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ != '\x01'
        || (local_29 = elseStatement.
                       super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                       _M_payload.
                       super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                       .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                       _8_1_ ^ 1,
           elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
           _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
           .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ !=
           '\x01')))) {
LAB_0010a475:
      bVar2 = false;
      goto LAB_0010a477;
    }
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012fb78;
    __p = (IfStatementAstNode *)(p_Var3 + 1);
    __gnu_cxx::new_allocator<IfStatementAstNode>::
    construct<IfStatementAstNode,std::shared_ptr<ExpressionAstNode>&,std::shared_ptr<StatementAstNode>&,std::shared_ptr<StatementAstNode>&>
              ((new_allocator<IfStatementAstNode> *)
               &ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged,__p,
               (shared_ptr<ExpressionAstNode> *)
               &elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged,
               (shared_ptr<StatementAstNode> *)
               &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
               (shared_ptr<StatementAstNode> *)&__dnew_2);
  }
  else {
    if (((local_29 != 0) ||
        (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
         _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ !=
         '\x01')) ||
       (local_29 = ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                   super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_
                   ^ 1,
       ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
       super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
       super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ != '\x01'))
    goto LAB_0010a475;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012fb78;
    __p = (IfStatementAstNode *)(p_Var3 + 1);
    __gnu_cxx::new_allocator<IfStatementAstNode>::
    construct<IfStatementAstNode,std::shared_ptr<ExpressionAstNode>&,std::shared_ptr<StatementAstNode>&>
              ((new_allocator<IfStatementAstNode> *)
               &ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged,__p,
               (shared_ptr<ExpressionAstNode> *)
               &elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged,
               (shared_ptr<StatementAstNode> *)
               &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged);
  }
  (__return_storage_ptr__->super__Optional_base<std::shared_ptr<IfStatementAstNode>,_false,_false>).
  _M_payload.super__Optional_payload<std::shared_ptr<IfStatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<IfStatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<IfStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  (__return_storage_ptr__->super__Optional_base<std::shared_ptr<IfStatementAstNode>,_false,_false>).
  _M_payload.super__Optional_payload<std::shared_ptr<IfStatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<IfStatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<IfStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  bVar2 = true;
LAB_0010a477:
  (__return_storage_ptr__->super__Optional_base<std::shared_ptr<IfStatementAstNode>,_false,_false>).
  _M_payload.super__Optional_payload<std::shared_ptr<IfStatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<IfStatementAstNode>_>._M_engaged = bVar2;
  if (elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload
      .super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ == '\x01') {
    elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ = 0;
    if (elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
        _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
        super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 elseStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  if (ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ == '\x01') {
    ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ = 0;
    if (ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload
        .super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
        super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ifStatement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  if (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ == '\x01')
  {
    expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ = 0;
    if (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload
        .super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._M_value.
        super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload.
                 _M_value.super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<IfStatementAstNode>>
Parser::parseIfStatement() noexcept {
  bool error = false;

  this->expect(TokenType::If, error, "Expected an if");

  this->skipWhiteSpace();

  this->expect(TokenType::LeftParen, error, "Expected a left paren after if");

  auto expression = this->parseExpression();

  this->expect(TokenType::RightParen, error, "Expected a right paren after expression of if");

  auto ifStatement = this->parseStatement();

  bool foundElse = false;
  std::optional<std::shared_ptr<StatementAstNode>> elseStatement{std::nullopt};

  if (this->tokenBuffer->currentToken()->tokenType == TokenType::Else) {
    foundElse = true;
    this->expect(TokenType::Else, error, "Expected an else");

    elseStatement = this->parseStatement();
  }

  if (foundElse) {
    error = error || !expression || !ifStatement || !elseStatement;

    if (error) { return std::nullopt; }

    return std::make_shared<IfStatementAstNode>(
      expression.value(), ifStatement.value(), elseStatement.value());
  }

  // else, we did not find an else

  error = error || !expression || !ifStatement;

  if (error) { return std::nullopt; }

  return std::make_shared<IfStatementAstNode>(expression.value(), ifStatement.value());
}